

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O3

void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk,int *pCounter)

{
  ulong uVar1;
  undefined4 uVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  Abc_Ntk_t *pAVar7;
  long *plVar8;
  int iVar9;
  char *pcVar10;
  Abc_Obj_t *pAVar11;
  int *piVar12;
  void *pvVar13;
  Vec_Ptr_t *pVVar14;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  long extraout_RDX_10;
  long extraout_RDX_11;
  long extraout_RDX_12;
  long extraout_RDX_13;
  long extraout_RDX_14;
  long extraout_RDX_15;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  char Suffix [2000];
  char local_808 [2008];
  
  memset(local_808,0,2000);
  if (pNtk->ntkFunc == ABC_FUNC_BLACKBOX) {
    if (pNtk->vBoxes->nSize != 1) {
      __assert_fail("Abc_NtkBoxNum(pNtk) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                    ,0x39,"void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
      ;
    }
    pAVar3 = (Abc_Obj_t *)*pNtk->vBoxes->pArray;
    Abc_NtkDupBox(pNtkNew,pAVar3,1);
    (((pAVar3->field_6).pCopy)->field_5).pData = pNtk;
    pAVar11 = (pAVar3->field_6).pCopy;
    iVar9 = (pAVar11->vFanins).nSize;
    pVVar14 = pNtk->vPis;
    if (iVar9 != pVVar14->nSize) {
      __assert_fail("Abc_ObjFaninNum(pObj->pCopy) == Abc_NtkPiNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                    ,0x3f,"void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
      ;
    }
    if (0 < iVar9) {
      lVar16 = 0;
      do {
        Abc_ObjAddFanin((Abc_Obj_t *)
                        ((pAVar3->field_6).pCopy)->pNtk->vObjs->pArray
                        [(((pAVar3->field_6).pCopy)->vFanins).pArray[lVar16]],
                        *(Abc_Obj_t **)
                         (*(long *)(*(long *)(*(long *)(*pVVar14->pArray[lVar16] + 0x20) + 8) +
                                   (long)**(int **)((long)pVVar14->pArray[lVar16] + 0x30) * 8) +
                         0x40));
        lVar16 = lVar16 + 1;
        pVVar14 = pNtk->vPis;
      } while (lVar16 < pVVar14->nSize);
      pAVar11 = (pAVar3->field_6).pCopy;
    }
    iVar9 = (pAVar11->vFanouts).nSize;
    pVVar14 = pNtk->vPos;
    if (iVar9 != pVVar14->nSize) {
      __assert_fail("Abc_ObjFanoutNum(pObj->pCopy) == Abc_NtkPoNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                    ,0x44,"void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
      ;
    }
    if (0 < iVar9) {
      lVar16 = 0;
      do {
        Abc_ObjAddFanin(*(Abc_Obj_t **)
                         (*(long *)(*(long *)(*(long *)(*pVVar14->pArray[lVar16] + 0x20) + 8) +
                                   (long)**(int **)((long)pVVar14->pArray[lVar16] + 0x20) * 8) +
                         0x40),(Abc_Obj_t *)
                               ((pAVar3->field_6).pCopy)->pNtk->vObjs->pArray
                               [(((pAVar3->field_6).pCopy)->vFanouts).pArray[lVar16]]);
        lVar16 = lVar16 + 1;
        pVVar14 = pNtk->vPos;
      } while (lVar16 < pVVar14->nSize);
    }
  }
  else {
    iVar9 = *pCounter;
    *pCounter = iVar9 + 1;
    lVar16 = extraout_RDX;
    if (iVar9 + 1 != 0) {
      sprintf(local_808,"_%s_%d",pNtk->pName);
      lVar16 = extraout_RDX_00;
    }
    pVVar14 = pNtk->vBoxes;
    if (0 < pVVar14->nSize) {
      lVar18 = 0;
      do {
        plVar4 = (long *)pVVar14->pArray[lVar18];
        iVar9 = *(int *)((long)plVar4 + 0x1c);
        if (0 < iVar9) {
          lVar17 = 0;
          do {
            plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)(plVar4[4] + lVar17 * 4) * 8);
            lVar16 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
            pAVar3 = *(Abc_Obj_t **)(lVar16 + (long)*(int *)plVar5[4] * 8);
            if ((pAVar3->field_6).pTemp == (void *)0x0) {
              pcVar10 = Abc_ObjNameSuffix(pAVar3,local_808);
              pAVar11 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar10);
              (pAVar3->field_6).pCopy = pAVar11;
              iVar9 = *(int *)((long)plVar4 + 0x1c);
              lVar16 = extraout_RDX_01;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < iVar9);
        }
        iVar9 = *(int *)((long)plVar4 + 0x2c);
        if (0 < iVar9) {
          lVar17 = 0;
          do {
            plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)(plVar4[6] + lVar17 * 4) * 8);
            lVar16 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
            pAVar3 = *(Abc_Obj_t **)(lVar16 + (long)*(int *)plVar5[6] * 8);
            if ((pAVar3->field_6).pTemp == (void *)0x0) {
              pcVar10 = Abc_ObjNameSuffix(pAVar3,local_808);
              pAVar11 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar10);
              (pAVar3->field_6).pCopy = pAVar11;
              iVar9 = *(int *)((long)plVar4 + 0x2c);
              lVar16 = extraout_RDX_02;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < iVar9);
        }
        lVar18 = lVar18 + 1;
        pVVar14 = pNtk->vBoxes;
      } while (lVar18 < pVVar14->nSize);
    }
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar9 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar9 + 500;
      iVar15 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar15) {
        piVar12 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar12;
        if (piVar12 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar15;
        lVar16 = extraout_RDX_03;
      }
      else {
        piVar12 = (int *)0x0;
      }
      if (-500 < iVar9) {
        memset(piVar12,0,(uVar1 & 0xffffffff) << 2);
        lVar16 = extraout_RDX_04;
      }
      (pNtk->vTravIds).nSize = iVar15;
    }
    iVar9 = pNtk->nTravIds;
    pNtk->nTravIds = iVar9 + 1;
    if (0x3ffffffe < iVar9) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                    ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    pVVar14 = pNtk->vPis;
    if (0 < pVVar14->nSize) {
      lVar18 = 0;
      do {
        lVar17 = *pVVar14->pArray[lVar18];
        iVar9 = (int)*(long *)((long)pVVar14->pArray[lVar18] + 0x10);
        uVar2 = *(undefined4 *)(lVar17 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar9 + 1,(int)lVar16);
        if (((long)iVar9 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar9)) goto LAB_001cd360;
        *(undefined4 *)(*(long *)(lVar17 + 0xe8) + (long)iVar9 * 4) = uVar2;
        lVar18 = lVar18 + 1;
        pVVar14 = pNtk->vPis;
        lVar16 = extraout_RDX_05;
      } while (lVar18 < pVVar14->nSize);
    }
    pVVar14 = pNtk->vPos;
    if (0 < pVVar14->nSize) {
      lVar18 = 0;
      do {
        plVar4 = (long *)pVVar14->pArray[lVar18];
        lVar17 = *plVar4;
        iVar9 = (int)plVar4[2];
        uVar2 = *(undefined4 *)(lVar17 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar9 + 1,(int)lVar16);
        if (((long)iVar9 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar9)) goto LAB_001cd360;
        *(undefined4 *)(*(long *)(lVar17 + 0xe8) + (long)iVar9 * 4) = uVar2;
        pAVar3 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
        pcVar10 = Abc_ObjName(pAVar3);
        iVar9 = strncmp(pcVar10,"abc_property",0xc);
        lVar16 = extraout_RDX_06;
        if (iVar9 == 0) {
          pAVar11 = Abc_NtkCreateObj(((pAVar3->field_6).pCopy)->pNtk,ABC_OBJ_PO);
          Abc_ObjAddFanin(pAVar11,(pAVar3->field_6).pCopy);
          pcVar10 = Nm_ManFindNameById(((pAVar3->field_6).pCopy)->pNtk->pManName,
                                       ((pAVar3->field_6).pCopy)->Id);
          if (pcVar10 != (char *)0x0) {
            Nm_ManDeleteIdName(((pAVar3->field_6).pCopy)->pNtk->pManName,
                               ((pAVar3->field_6).pCopy)->Id);
          }
          pAVar11 = (pAVar3->field_6).pCopy;
          pcVar10 = Abc_ObjName(pAVar3);
          Abc_ObjAssignName(pAVar11,pcVar10,local_808);
          lVar16 = extraout_RDX_07;
        }
        lVar18 = lVar18 + 1;
        pVVar14 = pNtk->vPos;
      } while (lVar18 < pVVar14->nSize);
    }
    pVVar14 = pNtk->vBoxes;
    if (0 < pVVar14->nSize) {
      lVar18 = 0;
      do {
        plVar4 = (long *)pVVar14->pArray[lVar18];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) != 8) {
          lVar17 = *plVar4;
          iVar9 = (int)plVar4[2];
          uVar2 = *(undefined4 *)(lVar17 + 0xd8);
          Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar9 + 1,(int)lVar16);
          if (((long)iVar9 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar9)) {
LAB_001cd360:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(lVar17 + 0xe8) + (long)iVar9 * 4) = uVar2;
          lVar16 = extraout_RDX_08;
          if (0 < *(int *)((long)plVar4 + 0x1c)) {
            lVar17 = 0;
            do {
              plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)(plVar4[4] + lVar17 * 4) * 8);
              lVar6 = *plVar5;
              iVar9 = (int)plVar5[2];
              uVar2 = *(undefined4 *)(lVar6 + 0xd8);
              Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar9 + 1,(int)lVar16);
              if (((long)iVar9 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar9)) goto LAB_001cd360;
              *(undefined4 *)(*(long *)(lVar6 + 0xe8) + (long)iVar9 * 4) = uVar2;
              lVar17 = lVar17 + 1;
              lVar16 = extraout_RDX_09;
            } while (lVar17 < *(int *)((long)plVar4 + 0x1c));
          }
          if (0 < *(int *)((long)plVar4 + 0x2c)) {
            lVar17 = 0;
            do {
              plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)(plVar4[6] + lVar17 * 4) * 8);
              lVar6 = *plVar5;
              iVar9 = (int)plVar5[2];
              uVar2 = *(undefined4 *)(lVar6 + 0xd8);
              Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar9 + 1,(int)lVar16);
              if (((long)iVar9 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar9)) goto LAB_001cd360;
              *(undefined4 *)(*(long *)(lVar6 + 0xe8) + (long)iVar9 * 4) = uVar2;
              lVar17 = lVar17 + 1;
              lVar16 = extraout_RDX_10;
            } while (lVar17 < *(int *)((long)plVar4 + 0x2c));
          }
        }
        lVar18 = lVar18 + 1;
        pVVar14 = pNtk->vBoxes;
      } while (lVar18 < pVVar14->nSize);
    }
    pVVar14 = pNtk->vObjs;
    if (0 < pVVar14->nSize) {
      lVar18 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pVVar14->pArray[lVar18];
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          pAVar7 = pAVar3->pNtk;
          iVar9 = pAVar3->Id;
          Vec_IntFillExtra(&pAVar7->vTravIds,iVar9 + 1,(int)lVar16);
          if (((long)iVar9 < 0) || ((pAVar7->vTravIds).nSize <= iVar9)) goto LAB_001cd39e;
          lVar16 = extraout_RDX_11;
          if (((pAVar7->vTravIds).pArray[iVar9] != pAVar3->pNtk->nTravIds) &&
             ((pAVar3->field_6).pTemp == (void *)0x0)) {
            Abc_NtkDupObj(pNtkNew,pAVar3,0);
            lVar16 = extraout_RDX_12;
          }
        }
        lVar18 = lVar18 + 1;
        pVVar14 = pNtk->vObjs;
      } while (lVar18 < pVVar14->nSize);
      if (0 < pVVar14->nSize) {
        lVar18 = 0;
        do {
          plVar4 = (long *)pVVar14->pArray[lVar18];
          if (plVar4 != (long *)0x0) {
            lVar17 = *plVar4;
            iVar9 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar9 + 1,(int)lVar16);
            if (((long)iVar9 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar9)) {
LAB_001cd39e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar16 = extraout_RDX_13;
            if ((*(int *)(*(long *)(lVar17 + 0xe8) + (long)iVar9 * 4) != *(int *)(*plVar4 + 0xd8))
               && (0 < *(int *)((long)plVar4 + 0x1c))) {
              lVar17 = 0;
              do {
                plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                   (long)*(int *)(plVar4[4] + lVar17 * 4) * 8);
                lVar6 = *plVar5;
                iVar9 = (int)plVar5[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar9 + 1,(int)lVar16);
                if (((long)iVar9 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar9)) goto LAB_001cd39e;
                lVar16 = extraout_RDX_14;
                if (*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar9 * 4) != *(int *)(*plVar5 + 0xd8))
                {
                  Abc_ObjAddFanin((Abc_Obj_t *)plVar4[8],(Abc_Obj_t *)plVar5[8]);
                  lVar16 = extraout_RDX_15;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < *(int *)((long)plVar4 + 0x1c));
            }
          }
          lVar18 = lVar18 + 1;
          pVVar14 = pNtk->vObjs;
        } while (lVar18 < pVVar14->nSize);
      }
    }
    pVVar14 = pNtk->vBoxes;
    if (0 < pVVar14->nSize) {
      lVar16 = 0;
      do {
        plVar4 = (long *)pVVar14->pArray[lVar16];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) != 8) {
          pAVar7 = (Abc_Ntk_t *)plVar4[7];
          if (*(int *)((long)plVar4 + 0x1c) != pAVar7->vPis->nSize) {
            __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                          ,0x97,
                          "void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
            ;
          }
          if (*(int *)((long)plVar4 + 0x2c) != pAVar7->vPos->nSize) {
            __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                          ,0x98,
                          "void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
            ;
          }
          Abc_NtkCleanCopy(pAVar7);
          if (0 < *(int *)((long)plVar4 + 0x1c)) {
            lVar18 = 0;
            do {
              if (pAVar7->vPis->nSize <= lVar18) goto LAB_001cd37f;
              plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)(plVar4[4] + lVar18 * 4) * 8);
              plVar8 = (long *)pAVar7->vPis->pArray[lVar18];
              *(undefined8 *)
               (*(long *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[6] * 8) +
               0x40) = *(undefined8 *)
                        (*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                  (long)*(int *)plVar5[4] * 8) + 0x40);
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)plVar4 + 0x1c));
          }
          if (0 < *(int *)((long)plVar4 + 0x2c)) {
            lVar18 = 0;
            do {
              if (pAVar7->vPos->nSize <= lVar18) goto LAB_001cd37f;
              plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)(plVar4[6] + lVar18 * 4) * 8);
              plVar8 = (long *)pAVar7->vPos->pArray[lVar18];
              *(undefined8 *)
               (*(long *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8) +
               0x40) = *(undefined8 *)
                        (*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                  (long)*(int *)plVar5[6] * 8) + 0x40);
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)plVar4 + 0x2c));
          }
          Abc_NtkFlattenLogicHierarchy2_rec(pNtkNew,pAVar7,pCounter);
          pVVar14 = pNtk->vBoxes;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < pVVar14->nSize);
    }
    if (pNtk->ntkFunc == ABC_FUNC_BLIFMV) {
      if (pNtk->vAttrs->nSize < 0xd) {
LAB_001cd37f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (pNtk->vAttrs->pArray[0xc] != (void *)0x0) {
        if (pNtkNew->vAttrs->nSize < 0xd) goto LAB_001cd37f;
        if (pNtkNew->vAttrs->pArray[0xc] == (void *)0x0) {
          Abc_NtkStartMvVars(pNtkNew);
        }
        pVVar14 = pNtk->vObjs;
        if (0 < pVVar14->nSize) {
          lVar16 = 0;
          do {
            pAVar3 = (Abc_Obj_t *)pVVar14->pArray[lVar16];
            if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 6)) {
              pVVar14 = pAVar3->pNtk->vAttrs;
              if (pVVar14->nSize < 0xd) goto LAB_001cd37f;
              pAVar11 = (pAVar3->field_6).pCopy;
              iVar9 = 2;
              if ((pVVar14->pArray[0xc] != (void *)0x0) &&
                 (pvVar13 = Abc_ObjMvVar(pAVar3), pvVar13 != (void *)0x0)) {
                piVar12 = (int *)Abc_ObjMvVar(pAVar3);
                iVar9 = *piVar12;
              }
              Abc_NtkSetMvVarValues(pAVar11,iVar9);
              pVVar14 = pNtk->vObjs;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < pVVar14->nSize);
        }
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Recursively flattens logic hierarchy of the netlist.]

  Description [When this procedure is called, the PI/PO nets of the old 
  netlist point to the corresponding nets of the flattened netlist.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkFlattenLogicHierarchy2_rec( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk, int * pCounter )
{
    char Suffix[2000] = {0};
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj, * pTerm, * pNet, * pFanin;
    int i, k;

    // process the blackbox
    if ( Abc_NtkHasBlackbox(pNtk) )
    {
        // duplicate the blackbox
        assert( Abc_NtkBoxNum(pNtk) == 1 );
        pObj = Abc_NtkBox( pNtk, 0 );
        Abc_NtkDupBox( pNtkNew, pObj, 1 );
        pObj->pCopy->pData = pNtk;

        // connect blackbox fanins to the PI nets
        assert( Abc_ObjFaninNum(pObj->pCopy) == Abc_NtkPiNum(pNtk) );
        Abc_NtkForEachPi( pNtk, pTerm, i )
            Abc_ObjAddFanin( Abc_ObjFanin(pObj->pCopy,i), Abc_ObjFanout0(pTerm)->pCopy );

        // connect blackbox fanouts to the PO nets
        assert( Abc_ObjFanoutNum(pObj->pCopy) == Abc_NtkPoNum(pNtk) );
        Abc_NtkForEachPo( pNtk, pTerm, i )
            Abc_ObjAddFanin( Abc_ObjFanin0(pTerm)->pCopy, Abc_ObjFanout(pObj->pCopy,i) );
        return;
    }

    (*pCounter)++;

    // create the suffix, which will be appended to the internal names
    if ( *pCounter )
        sprintf( Suffix, "_%s_%d", Abc_NtkName(pNtk), *pCounter );

    // duplicate nets of all boxes, including latches
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pTerm, k )
        {
            pNet = Abc_ObjFanin0(pTerm);
            if ( pNet->pCopy )
                continue;
            pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjNameSuffix(pNet, Suffix) );
        }
        Abc_ObjForEachFanout( pObj, pTerm, k )
        {
            pNet = Abc_ObjFanout0(pTerm);
            if ( pNet->pCopy )
                continue;
            pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjNameSuffix(pNet, Suffix) );
        }
    }

    // mark objects that will not be used
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NodeSetTravIdCurrent( pTerm );
        // if the netlist has net names beginning with "abc_property_"
        // these names will be addes as primary outputs of the network
        pNet = Abc_ObjFanin0(pTerm);
        if ( strncmp( Abc_ObjName(pNet), "abc_property", 12 ) )
            continue;
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNet->pCopy->pNtk), pNet->pCopy );
        if ( Nm_ManFindNameById(pNet->pCopy->pNtk->pManName, pNet->pCopy->Id) )
            Nm_ManDeleteIdName(pNet->pCopy->pNtk->pManName, pNet->pCopy->Id);
        Abc_ObjAssignName( pNet->pCopy, Abc_ObjName(pNet), Suffix );
    }
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_NodeSetTravIdCurrent( pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_NodeSetTravIdCurrent( pTerm );
    }

    // duplicate objects that do not have prototypes yet
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        if ( pObj->pCopy )
            continue;
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    }

    // connect objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // call recursively
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
        // clean the node copy fields
        Abc_NtkCleanCopy( pNtkModel );
        // map PIs/POs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->pCopy = Abc_ObjFanin0(pTerm)->pCopy;
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->pCopy = Abc_ObjFanout0(pTerm)->pCopy;
        // call recursively
        Abc_NtkFlattenLogicHierarchy2_rec( pNtkNew, pNtkModel, pCounter );
    }

    // if it is a BLIF-MV netlist transfer the values of all nets
    if ( Abc_NtkHasBlifMv(pNtk) && Abc_NtkMvVar(pNtk) )
    {
        if ( Abc_NtkMvVar( pNtkNew ) == NULL )
            Abc_NtkStartMvVars( pNtkNew );
        Abc_NtkForEachNet( pNtk, pObj, i )
            Abc_NtkSetMvVarValues( pObj->pCopy, Abc_ObjMvVarNum(pObj) );
    }
}